

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adl_lsp_server.h
# Opt level: O3

void lscpp::experimental::launch<my_lsp_server::server>(server *server,transporter *transporter_)

{
  undefined8 uVar1;
  void *__stat_loc;
  future<void> rcv;
  _State_baseV2 *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  transporter *local_18;
  server *local_10;
  
  __stat_loc = (void *)0x1;
  local_18 = transporter_;
  local_10 = server;
  std::
  async<lscpp::experimental::launch<my_lsp_server::server>(my_lsp_server::server&&,lscpp::transporter&&)::_lambda()_1_>
            ((launch)&local_28,(anon_class_16_2_440fc4b3_for__M_head_impl *)0x1);
  if (local_28 != (_State_baseV2 *)0x0) {
    std::__future_base::_State_baseV2::wait(local_28,__stat_loc);
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
    return;
  }
  uVar1 = std::__throw_future_error(3);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  _Unwind_Resume(uVar1);
}

Assistant:

void launch(Server &&server, transporter &&transporter_) {

  // Allows to attach a debugger,
  // before the language server starts to communicate with the client.
  //   std::this_thread::sleep_for(std::chrono::seconds(config.startup_delay));

  auto rcv = std::async(std::launch::async, [&]() {
    while (true) {
      auto header = parse_header(transporter_);

      if (header.content_length <
          0) { // TODO parse header should not use -1 to report an error
        continue;
      }
      auto msg = transporter_.read_message(header.content_length);

      auto result = lscpp_handle_message(server, msg);
      if (result) {
        write_lsp_message(transporter_, *result);
      }
    }
  });

  rcv.wait();
}